

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-again.c
# Opt level: O2

int run_test_timer_again(void)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_20;
  
  uVar2 = uv_default_loop();
  start_time = uv_now(uVar2);
  if (start_time == 0) {
    pcVar4 = "0 < start_time";
    uStack_20 = 99;
  }
  else {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&dummy);
    if (iVar1 == 0) {
      iVar1 = uv_timer_again(&dummy);
      if (iVar1 == -0x16) {
        uv_unref(&dummy);
        uVar2 = uv_default_loop();
        iVar1 = uv_timer_init(uVar2,&repeat_1);
        if (iVar1 == 0) {
          iVar1 = uv_timer_start(&repeat_1,repeat_1_cb,0x32,0);
          if (iVar1 == 0) {
            lVar3 = uv_timer_get_repeat(&repeat_1);
            if (lVar3 == 0) {
              uv_timer_set_repeat(&repeat_1,0x32);
              lVar3 = uv_timer_get_repeat(&repeat_1);
              if (lVar3 == 0x32) {
                uVar2 = uv_default_loop();
                iVar1 = uv_timer_init(uVar2,&repeat_2);
                if (iVar1 == 0) {
                  iVar1 = uv_timer_start(&repeat_2,repeat_2_cb,100);
                  if (iVar1 == 0) {
                    lVar3 = uv_timer_get_repeat(&repeat_2);
                    if (lVar3 == 100) {
                      uVar2 = uv_default_loop();
                      uv_run(uVar2,0);
                      __stream = _stderr;
                      if (repeat_1_cb_called == 10) {
                        if (repeat_2_cb_called == 2) {
                          if (close_cb_called == 2) {
                            uVar2 = uv_default_loop();
                            lVar3 = uv_now(uVar2);
                            fprintf(__stream,"Test took %ld ms (expected ~700 ms)\n",
                                    lVar3 - start_time);
                            fflush(_stderr);
                            uVar2 = uv_default_loop();
                            uv_walk(uVar2,close_walk_cb,0);
                            uv_run(uVar2,0);
                            uVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(uVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_20 = 0x8b;
                          }
                          else {
                            pcVar4 = "close_cb_called == 2";
                            uStack_20 = 0x85;
                          }
                        }
                        else {
                          pcVar4 = "repeat_2_cb_called == 2";
                          uStack_20 = 0x84;
                        }
                      }
                      else {
                        pcVar4 = "repeat_1_cb_called == 10";
                        uStack_20 = 0x83;
                      }
                    }
                    else {
                      pcVar4 = "uv_timer_get_repeat(&repeat_2) == 100";
                      uStack_20 = 0x7f;
                    }
                  }
                  else {
                    pcVar4 = "r == 0";
                    uStack_20 = 0x7e;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uStack_20 = 0x7c;
                }
              }
              else {
                pcVar4 = "uv_timer_get_repeat(&repeat_1) == 50";
                uStack_20 = 0x75;
              }
            }
            else {
              pcVar4 = "uv_timer_get_repeat(&repeat_1) == 0";
              uStack_20 = 0x71;
            }
          }
          else {
            pcVar4 = "r == 0";
            uStack_20 = 0x70;
          }
        }
        else {
          pcVar4 = "r == 0";
          uStack_20 = 0x6e;
        }
      }
      else {
        pcVar4 = "r == UV_EINVAL";
        uStack_20 = 0x69;
      }
    }
    else {
      pcVar4 = "r == 0";
      uStack_20 = 0x67;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-again.c"
          ,uStack_20,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(timer_again) {
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Verify that it is not possible to uv_timer_again a never-started timer. */
  r = uv_timer_init(uv_default_loop(), &dummy);
  ASSERT(r == 0);
  r = uv_timer_again(&dummy);
  ASSERT(r == UV_EINVAL);
  uv_unref((uv_handle_t*)&dummy);

  /* Start timer repeat_1. */
  r = uv_timer_init(uv_default_loop(), &repeat_1);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat_1, repeat_1_cb, 50, 0);
  ASSERT(r == 0);
  ASSERT(uv_timer_get_repeat(&repeat_1) == 0);

  /* Actually make repeat_1 repeating. */
  uv_timer_set_repeat(&repeat_1, 50);
  ASSERT(uv_timer_get_repeat(&repeat_1) == 50);

  /*
   * Start another repeating timer. It'll be again()ed by the repeat_1 so
   * it should not time out until repeat_1 stops.
   */
  r = uv_timer_init(uv_default_loop(), &repeat_2);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat_2, repeat_2_cb, 100, 100);
  ASSERT(r == 0);
  ASSERT(uv_timer_get_repeat(&repeat_2) == 100);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(repeat_1_cb_called == 10);
  ASSERT(repeat_2_cb_called == 2);
  ASSERT(close_cb_called == 2);

  fprintf(stderr, "Test took %ld ms (expected ~700 ms)\n",
          (long int)(uv_now(uv_default_loop()) - start_time));
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}